

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O1

void __thiscall
GlobalBailOutRecordDataTable::Finalize
          (GlobalBailOutRecordDataTable *this,Allocator *allocator,JitArenaAllocator *tempAlloc)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  GlobalBailOutRecordDataRow *__dest;
  long lVar6;
  uint32 i;
  ulong uVar7;
  uint32 *puVar8;
  
  uVar1 = this->length;
  BVar4 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar3) goto LAB_00404744;
    *puVar5 = 0;
  }
  __dest = (GlobalBailOutRecordDataRow *)
           NativeCodeData::Allocator::AllocZero(allocator,(ulong)uVar1 << 4);
  if (__dest == (GlobalBailOutRecordDataRow *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) {
LAB_00404744:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  memcpy(__dest,this->globalBailOutRecordDataRows,(ulong)this->length << 4);
  Memory::DeleteArray<Memory::JitArenaAllocator,GlobalBailOutRecordDataRow>
            (tempAlloc,(ulong)this->length,this->globalBailOutRecordDataRows);
  this->globalBailOutRecordDataRows = __dest;
  this->size = this->length;
  if (1 < this->length) {
    puVar8 = &__dest->start;
    uVar7 = 1;
    lVar6 = 0x14;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if (*(uint *)((long)&this->globalBailOutRecordDataRows->offset + lVar6) < *puVar8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0xbb6,"(currStart <= globalBailOutRecordDataRows[i].start)",
                           "Rows in the table must be in order by start ID");
        if (!bVar3) goto LAB_00404744;
        *puVar5 = 0;
      }
      puVar8 = (uint32 *)((long)&this->globalBailOutRecordDataRows->offset + lVar6);
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < this->length);
  }
  return;
}

Assistant:

void GlobalBailOutRecordDataTable::Finalize(NativeCodeData::Allocator *allocator, JitArenaAllocator *tempAlloc)
{
    GlobalBailOutRecordDataRow *newRows = NativeCodeDataNewArrayZNoFixup(allocator, GlobalBailOutRecordDataRow, length);
    memcpy(newRows, globalBailOutRecordDataRows, sizeof(GlobalBailOutRecordDataRow) * length);
    JitAdeleteArray(tempAlloc, length, globalBailOutRecordDataRows);
    globalBailOutRecordDataRows = newRows;
    size = length;

#if DBG
    if (length > 0)
    {
        uint32 currStart = globalBailOutRecordDataRows[0].start;
        for (uint32 i = 1; i < length; i++)
        {
            AssertMsg(currStart <= globalBailOutRecordDataRows[i].start,
                      "Rows in the table must be in order by start ID");
            currStart = globalBailOutRecordDataRows[i].start;
        }
    }
#endif
}